

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

void llama_sampler_infill_free(llama_sampler *smpl)

{
  long in_RDI;
  llama_sampler_infill *this;
  
  this = *(llama_sampler_infill **)(in_RDI + 8);
  if (this != (llama_sampler_infill *)0x0) {
    llama_sampler_infill::~llama_sampler_infill(this);
    operator_delete(this,0x38);
  }
  return;
}

Assistant:

static void llama_sampler_infill_free(struct llama_sampler * smpl) {
    delete (llama_sampler_infill *) smpl->ctx;
}